

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_buf.c
# Opt level: O2

ares_status_t ares_buf_set_length(ares_buf_t *buf,size_t len)

{
  ares_status_t aVar1;
  
  aVar1 = ARES_EFORMERR;
  if ((buf != (ares_buf_t *)0x0) &&
     (((buf->data == (uchar *)0x0 || (buf->alloc_buf != (uchar *)0x0)) &&
      (len < buf->alloc_buf_len - buf->offset)))) {
    buf->data_len = buf->offset + len;
    aVar1 = ARES_SUCCESS;
  }
  return aVar1;
}

Assistant:

ares_status_t ares_buf_set_length(ares_buf_t *buf, size_t len)
{
  if (buf == NULL || ares_buf_is_const(buf)) {
    return ARES_EFORMERR; /* LCOV_EXCL_LINE: DefensiveCoding */
  }

  if (len >= buf->alloc_buf_len - buf->offset) {
    return ARES_EFORMERR; /* LCOV_EXCL_LINE: DefensiveCoding */
  }

  buf->data_len = len + buf->offset;
  return ARES_SUCCESS;
}